

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

jx9_io_stream * jx9VmGetStreamDevice(jx9_vm *pVm,char **pzDevice,int nByte)

{
  char cVar1;
  void *pvVar2;
  char *pcVar3;
  int iVar4;
  ushort **ppuVar5;
  char *pcVar6;
  sxu32 SLen;
  ulong uVar7;
  ulong uVar8;
  char *pcVar9;
  uint uVar10;
  uint uVar11;
  char *pcVar12;
  ulong uVar13;
  char *zLeft;
  jx9_io_stream *pjVar14;
  bool bVar15;
  
  zLeft = *pzDevice;
  bVar15 = 0 < nByte;
  pcVar9 = zLeft;
  pcVar12 = zLeft;
  if (0 < nByte) {
    do {
      if ((((pcVar12 < zLeft + nByte + -3) && (*pcVar12 == ':')) && (pcVar12[1] == '/')) &&
         (pcVar12[2] == '/')) {
        pcVar9 = pcVar12 + 3;
        break;
      }
      pcVar12 = pcVar12 + 1;
      bVar15 = pcVar12 < zLeft + nByte;
    } while (bVar15);
  }
  if (bVar15) {
    uVar10 = (int)pcVar12 - (int)zLeft;
    if (uVar10 != 0) {
      do {
        cVar1 = *zLeft;
        if ((0xffffffffffffffbf < (ulong)(long)cVar1) ||
           (ppuVar5 = __ctype_b_loc(), (*(byte *)((long)*ppuVar5 + (long)cVar1 * 2 + 1) & 0x20) == 0
           )) goto LAB_0012dff7;
        zLeft = zLeft + 1;
        uVar10 = uVar10 - 1;
      } while (uVar10 != 0);
      uVar10 = 0;
    }
LAB_0012dff7:
    uVar11 = ~uVar10;
    uVar7 = (ulong)uVar10;
    do {
      if (uVar7 == 0) {
        uVar7 = 0;
        goto LAB_0012e03e;
      }
      cVar1 = zLeft[uVar7 - 1];
      if (0xffffffffffffffbf < (ulong)(long)cVar1) goto LAB_0012e03e;
      ppuVar5 = __ctype_b_loc();
      uVar11 = uVar11 + 1;
      uVar7 = uVar7 - 1;
    } while ((*(byte *)((long)*ppuVar5 + (long)cVar1 * 2 + 1) & 0x20) != 0);
    uVar7 = (ulong)-uVar11;
LAB_0012e03e:
    uVar13 = (ulong)(pVm->aIOstream).nUsed;
    if (uVar13 != 0) {
      pvVar2 = (pVm->aIOstream).pBase;
      uVar8 = 0;
      do {
        pjVar14 = *(jx9_io_stream **)((long)pvVar2 + uVar8 * 8);
        pcVar12 = pjVar14->zName;
        pcVar6 = pcVar12;
        if (*pcVar12 != '\0') {
          pcVar3 = pcVar12 + 2;
          do {
            pcVar6 = pcVar3;
            if (pcVar6[-1] == '\0') {
              pcVar6 = pcVar6 + -1;
              goto LAB_0012e095;
            }
            if (*pcVar6 == '\0') goto LAB_0012e095;
            if (pcVar6[1] == '\0') {
              pcVar6 = pcVar6 + 1;
              goto LAB_0012e095;
            }
            pcVar3 = pcVar6 + 4;
          } while (pcVar6[2] != '\0');
          pcVar6 = pcVar6 + 2;
        }
LAB_0012e095:
        SLen = (int)pcVar6 - (int)pcVar12;
        iVar4 = (int)uVar7 - SLen;
        if (iVar4 == 0) {
          iVar4 = SyStrnicmp(zLeft,pcVar12,SLen);
        }
        if (iVar4 == 0) {
          *pzDevice = pcVar9;
          return pjVar14;
        }
        uVar8 = uVar8 + 1;
      } while (uVar8 != uVar13);
    }
    pjVar14 = (jx9_io_stream *)0x0;
  }
  else {
    pjVar14 = pVm->pDefStream;
  }
  return pjVar14;
}

Assistant:

JX9_PRIVATE const jx9_io_stream * jx9VmGetStreamDevice(
	jx9_vm *pVm,           /* Target VM */
	const char **pzDevice, /* Full path, URI, ... */
	int nByte              /* *pzDevice length*/
	)
{
	const char *zIn, *zEnd, *zCur, *zNext;
	jx9_io_stream **apStream, *pStream;
	SyString sDev, sCur;
	sxu32 n, nEntry;
	int rc;
	/* Check if a scheme [i.e: file://, http://, zip://...] is available */
	zNext = zCur = zIn = *pzDevice;
	zEnd = &zIn[nByte];
	while( zIn < zEnd ){
		if( zIn < &zEnd[-3]/*://*/ && zIn[0] == ':' && zIn[1] == '/' && zIn[2] == '/' ){
			/* Got one */
			zNext = &zIn[sizeof("://")-1];
			break;
		}
		/* Advance the cursor */
		zIn++;
	}
	if( zIn >= zEnd ){
		/* No such scheme, return the default stream */
		return pVm->pDefStream;
	}
	SyStringInitFromBuf(&sDev, zCur, zIn-zCur);
	/* Remove leading and trailing white spaces */
	SyStringFullTrim(&sDev);
	/* Perform a linear lookup on the installed stream devices */
	apStream = (jx9_io_stream **)SySetBasePtr(&pVm->aIOstream);
	nEntry = SySetUsed(&pVm->aIOstream);
	for( n = 0 ; n < nEntry ; n++ ){
		pStream = apStream[n];
		SyStringInitFromBuf(&sCur, pStream->zName, SyStrlen(pStream->zName));
		/* Perfrom a case-insensitive comparison */
		rc = SyStringCmp(&sDev, &sCur, SyStrnicmp);
		if( rc == 0 ){
			/* Stream device found */
			*pzDevice = zNext;
			return pStream;
		}
	}
	/* No such stream, return NULL */
	return 0;
}